

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFuture.cpp
# Opt level: O0

void testFuture(void)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  unsigned_long *puVar4;
  String local_1110;
  String local_10e8;
  String local_10c0;
  String local_1098;
  FutureTest local_1070;
  FutureTest t_8;
  Future<unsigned_long> future_20;
  String local_fe0;
  String local_fb8;
  String local_f90;
  FutureTest local_f68;
  FutureTest t_7;
  Future<unsigned_long> future_19;
  String local_ed8;
  String local_eb0;
  FutureTest local_e88;
  FutureTest t_6;
  Future<unsigned_long> future_18;
  String local_df8;
  FutureTest local_dd0;
  FutureTest t_5;
  Future<unsigned_long> future_17;
  String local_d28;
  String local_d00;
  String local_cd8;
  String local_cb0;
  undefined1 local_c88 [8];
  Future<unsigned_long> future_16;
  String local_be8;
  String local_bc0;
  String local_b98;
  undefined1 local_b70 [8];
  Future<unsigned_long> future_15;
  String local_ad0;
  String local_aa8;
  undefined1 local_a80 [8];
  Future<unsigned_long> future_14;
  String local_9e0;
  undefined1 local_9b8 [8];
  Future<unsigned_long> future_13;
  undefined1 local_918 [8];
  Future<unsigned_long> future_12;
  Future<unsigned_long> future_11;
  String local_818;
  String local_7f0;
  String local_7c8;
  undefined1 local_79c [4];
  FutureTest local_798;
  FutureTest t_4;
  Future<void> future_10;
  String local_710;
  String local_6e8;
  undefined1 local_6bc [4];
  FutureTest local_6b8;
  FutureTest t_3;
  Future<void> future_9;
  String local_630;
  undefined1 local_604 [4];
  FutureTest local_600;
  FutureTest t_2;
  Future<void> future_8;
  FutureTest local_570;
  FutureTest t_1;
  Future<void> future_7;
  FutureTest local_4e8;
  FutureTest t;
  Future<void> future_6;
  String local_448;
  String local_420;
  String local_3f8;
  int local_3cc;
  undefined1 local_3c8 [8];
  Future<void> future_5;
  String local_330;
  String local_308;
  int local_2dc;
  undefined1 local_2d8 [8];
  Future<void> future_4;
  String local_240;
  int local_214;
  undefined1 local_210 [8];
  Future<void> future_3;
  int local_174;
  undefined1 local_170 [8];
  Future<void> future_2;
  undefined1 local_f8 [8];
  Future<void> future_1;
  undefined1 local_78 [8];
  Future<void> future;
  
  Future<void>::Future((Future<void> *)local_78);
  bVar2 = Future<void>::isAborting((Future<void> *)local_78);
  if ((bVar2) &&
     (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                            ,0x97,"!future.isAborting()"), iVar3 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  bVar2 = Future<void>::isFinished((Future<void> *)local_78);
  if ((bVar2) &&
     (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                            ,0x98,"!future.isFinished()"), iVar3 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  bVar2 = Future<void>::isAborted((Future<void> *)local_78);
  if ((bVar2) &&
     (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                            ,0x99,"!future.isAborted()"), iVar3 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  Future<void>::start((Future<void> *)local_78,testFuture::FutureTest::staticVoidTest0);
  Future<void>::join((Future<void> *)local_78);
  bVar2 = Future<void>::isAborting((Future<void> *)local_78);
  if ((bVar2) &&
     (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                            ,0x9c,"!future.isAborting()"), iVar3 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  bVar2 = Future<void>::isFinished((Future<void> *)local_78);
  if ((!bVar2) &&
     (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                            ,0x9d,"future.isFinished()"), iVar3 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  bVar2 = Future<void>::isAborted((Future<void> *)local_78);
  if ((bVar2) &&
     (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                            ,0x9e,"!future.isAborted()"), iVar3 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  Future<void>::~Future((Future<void> *)local_78);
  Future<void>::Future((Future<void> *)local_f8);
  future_2._108_4_ = 0x20;
  Future<void>::start<int,int>
            ((Future<void> *)local_f8,testFuture::FutureTest::staticVoidTest1,
             (int *)&future_2.field_0x6c);
  Future<void>::join((Future<void> *)local_f8);
  Future<void>::~Future((Future<void> *)local_f8);
  Future<void>::Future((Future<void> *)local_170);
  local_174 = 0x20;
  String::String<7ul>((String *)&future_3._joinable,(char (*) [7])"hallo1");
  Future<void>::start<int,String_const&,int,String>
            ((Future<void> *)local_170,testFuture::FutureTest::staticVoidTest2,&local_174,
             (String *)&future_3._joinable);
  String::~String((String *)&future_3._joinable);
  Future<void>::join((Future<void> *)local_170);
  Future<void>::~Future((Future<void> *)local_170);
  Future<void>::Future((Future<void> *)local_210);
  local_214 = 0x20;
  String::String<7ul>(&local_240,(char (*) [7])"hallo1");
  String::String<7ul>((String *)&future_4._joinable,(char (*) [7])"hallo2");
  Future<void>::start<int,String_const&,String_const&,int,String,String>
            ((Future<void> *)local_210,testFuture::FutureTest::staticVoidTest3,&local_214,&local_240
             ,(String *)&future_4._joinable);
  String::~String((String *)&future_4._joinable);
  String::~String(&local_240);
  Future<void>::join((Future<void> *)local_210);
  Future<void>::~Future((Future<void> *)local_210);
  Future<void>::Future((Future<void> *)local_2d8);
  local_2dc = 0x20;
  String::String<7ul>(&local_308,(char (*) [7])"hallo1");
  String::String<7ul>(&local_330,(char (*) [7])"hallo2");
  String::String<7ul>((String *)&future_5._joinable,(char (*) [7])"hallo3");
  Future<void>::start<int,String_const&,String_const&,String_const&,int,String,String,String>
            ((Future<void> *)local_2d8,testFuture::FutureTest::staticVoidTest4,&local_2dc,&local_308
             ,&local_330,(String *)&future_5._joinable);
  String::~String((String *)&future_5._joinable);
  String::~String(&local_330);
  String::~String(&local_308);
  Future<void>::join((Future<void> *)local_2d8);
  Future<void>::~Future((Future<void> *)local_2d8);
  Future<void>::Future((Future<void> *)local_3c8);
  local_3cc = 0x20;
  String::String<7ul>(&local_3f8,(char (*) [7])"hallo1");
  String::String<7ul>(&local_420,(char (*) [7])"hallo2");
  String::String<7ul>(&local_448,(char (*) [7])"hallo3");
  String::String<7ul>((String *)&future_6._joinable,(char (*) [7])"hallo4");
  Future<void>::
  start<int,String_const&,String_const&,String_const&,String_const&,int,String,String,String,String>
            ((Future<void> *)local_3c8,testFuture::FutureTest::staticVoidTest5,&local_3cc,&local_3f8
             ,&local_420,&local_448,(String *)&future_6._joinable);
  String::~String((String *)&future_6._joinable);
  String::~String(&local_448);
  String::~String(&local_420);
  String::~String(&local_3f8);
  Future<void>::join((Future<void> *)local_3c8);
  Future<void>::~Future((Future<void> *)local_3c8);
  Future<void>::Future((Future<void> *)&t);
  testFuture::FutureTest::FutureTest(&local_4e8);
  Future<void>::start<testFuture()::FutureTest>((Future<void> *)&t,&local_4e8,0x104700);
  Future<void>::join((Future<void> *)&t);
  if (((local_4e8.called & 1U) == 0) &&
     (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                            ,0xc4,"t.called"), iVar3 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  Future<void>::~Future((Future<void> *)&t);
  Future<void>::Future((Future<void> *)&t_1);
  testFuture::FutureTest::FutureTest(&local_570);
  Future<void>::start<testFuture()::FutureTest,int,int>
            ((Future<void> *)&t_1,&local_570,0x1047d0,(int *)0x0);
  Future<void>::join((Future<void> *)&t_1);
  if (((local_570.called & 1U) == 0) &&
     (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                            ,0xcc,"t.called"), iVar3 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  Future<void>::~Future((Future<void> *)&t_1);
  Future<void>::Future((Future<void> *)&t_2);
  testFuture::FutureTest::FutureTest(&local_600);
  local_604 = (undefined1  [4])0x20;
  String::String<7ul>(&local_630,(char (*) [7])"hallo1");
  Future<void>::start<testFuture()::FutureTest,int,String_const&,int,String>
            ((Future<void> *)&t_2,&local_600,0x1048f0,(int *)0x0,(String *)local_604);
  String::~String(&local_630);
  Future<void>::join((Future<void> *)&t_2);
  if (((local_600.called & 1U) == 0) &&
     (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                            ,0xd4,"t.called"), iVar3 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  Future<void>::~Future((Future<void> *)&t_2);
  Future<void>::Future((Future<void> *)&t_3);
  testFuture::FutureTest::FutureTest(&local_6b8);
  local_6bc = (undefined1  [4])0x20;
  String::String<7ul>(&local_6e8,(char (*) [7])"hallo1");
  String::String<7ul>(&local_710,(char (*) [7])"hallo2");
  Future<void>::start<testFuture()::FutureTest,int,String_const&,String_const&,int,String,String>
            ((Future<void> *)&t_3,&local_6b8,0x104a50,(int *)0x0,(String *)local_6bc,&local_6e8);
  String::~String(&local_710);
  String::~String(&local_6e8);
  Future<void>::join((Future<void> *)&t_3);
  if (((local_6b8.called & 1U) == 0) &&
     (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                            ,0xdc,"t.called"), iVar3 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  Future<void>::~Future((Future<void> *)&t_3);
  Future<void>::Future((Future<void> *)&t_4);
  testFuture::FutureTest::FutureTest(&local_798);
  local_79c = (undefined1  [4])0x20;
  String::String<7ul>(&local_7c8,(char (*) [7])"hallo1");
  String::String<7ul>(&local_7f0,(char (*) [7])"hallo2");
  String::String<7ul>(&local_818,(char (*) [7])"hallo3");
  Future<void>::
  start<testFuture()::FutureTest,int,String_const&,String_const&,String_const&,int,String,String,String>
            ((Future<void> *)&t_4,&local_798,0x104c00,(int *)0x0,(String *)local_79c,&local_7c8,
             &local_7f0);
  String::~String(&local_818);
  String::~String(&local_7f0);
  String::~String(&local_7c8);
  Future<void>::join((Future<void> *)&t_4);
  if (((local_798.called & 1U) == 0) &&
     (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                            ,0xe4,"t.called"), iVar3 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  Future<void>::~Future((Future<void> *)&t_4);
  Future<unsigned_long>::Future((Future<unsigned_long> *)&future_12.result);
  Future<unsigned_long>::start
            ((Future<unsigned_long> *)&future_12.result,testFuture::FutureTest::staticTest0);
  Future<unsigned_long>::join((Future<unsigned_long> *)&future_12.result);
  puVar4 = Future::operator_cast_to_unsigned_long_((Future *)&future_12.result);
  if ((*puVar4 != 0x20) &&
     (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                            ,0xeb,"future == 32"), iVar3 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  Future<unsigned_long>::~Future((Future<unsigned_long> *)&future_12.result);
  Future<unsigned_long>::Future((Future<unsigned_long> *)local_918);
  String::String<6ul>((String *)&future_13.result,(char (*) [6])"hello");
  Future<unsigned_long>::start<String_const&,String>
            ((Future<unsigned_long> *)local_918,testFuture::FutureTest::staticTest1,
             (String *)&future_13.result);
  String::~String((String *)&future_13.result);
  Future<unsigned_long>::join((Future<unsigned_long> *)local_918);
  puVar4 = Future::operator_cast_to_unsigned_long_((Future *)local_918);
  if ((*puVar4 != 5) &&
     (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                            ,0xf2,"future == 5"), iVar3 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  Future<unsigned_long>::~Future((Future<unsigned_long> *)local_918);
  Future<unsigned_long>::Future((Future<unsigned_long> *)local_9b8);
  String::String<6ul>(&local_9e0,(char (*) [6])"hello");
  String::String<6ul>((String *)&future_14.result,(char (*) [6])"hello");
  Future<unsigned_long>::start<String_const&,String_const&,String,String>
            ((Future<unsigned_long> *)local_9b8,testFuture::FutureTest::staticTest2,&local_9e0,
             (String *)&future_14.result);
  String::~String((String *)&future_14.result);
  String::~String(&local_9e0);
  Future<unsigned_long>::join((Future<unsigned_long> *)local_9b8);
  puVar4 = Future::operator_cast_to_unsigned_long_((Future *)local_9b8);
  if ((*puVar4 != 10) &&
     (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                            ,0xf9,"future == 10"), iVar3 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  Future<unsigned_long>::~Future((Future<unsigned_long> *)local_9b8);
  Future<unsigned_long>::Future((Future<unsigned_long> *)local_a80);
  String::String<6ul>(&local_aa8,(char (*) [6])"hello");
  String::String<6ul>(&local_ad0,(char (*) [6])"hello");
  String::String<6ul>((String *)&future_15.result,(char (*) [6])"hello");
  Future<unsigned_long>::start<String_const&,String_const&,String_const&,String,String,String>
            ((Future<unsigned_long> *)local_a80,testFuture::FutureTest::staticTest3,&local_aa8,
             &local_ad0,(String *)&future_15.result);
  String::~String((String *)&future_15.result);
  String::~String(&local_ad0);
  String::~String(&local_aa8);
  Future<unsigned_long>::join((Future<unsigned_long> *)local_a80);
  puVar4 = Future::operator_cast_to_unsigned_long_((Future *)local_a80);
  if ((*puVar4 != 0xf) &&
     (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                            ,0x100,"future == 15"), iVar3 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  Future<unsigned_long>::~Future((Future<unsigned_long> *)local_a80);
  Future<unsigned_long>::Future((Future<unsigned_long> *)local_b70);
  String::String<6ul>(&local_b98,(char (*) [6])"hello");
  String::String<6ul>(&local_bc0,(char (*) [6])"hello");
  String::String<6ul>(&local_be8,(char (*) [6])"hello");
  String::String<6ul>((String *)&future_16.result,(char (*) [6])"hello");
  Future<unsigned_long>::
  start<String_const&,String_const&,String_const&,String_const&,String,String,String,String>
            ((Future<unsigned_long> *)local_b70,testFuture::FutureTest::staticTest4,&local_b98,
             &local_bc0,&local_be8,(String *)&future_16.result);
  String::~String((String *)&future_16.result);
  String::~String(&local_be8);
  String::~String(&local_bc0);
  String::~String(&local_b98);
  Future<unsigned_long>::join((Future<unsigned_long> *)local_b70);
  puVar4 = Future::operator_cast_to_unsigned_long_((Future *)local_b70);
  if ((*puVar4 != 0x14) &&
     (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                            ,0x107,"future == 20"), iVar3 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  Future<unsigned_long>::~Future((Future<unsigned_long> *)local_b70);
  Future<unsigned_long>::Future((Future<unsigned_long> *)local_c88);
  String::String<6ul>(&local_cb0,(char (*) [6])"hello");
  String::String<6ul>(&local_cd8,(char (*) [6])"hello");
  String::String<6ul>(&local_d00,(char (*) [6])"hello");
  String::String<6ul>(&local_d28,(char (*) [6])"hello");
  String::String<6ul>((String *)&future_17.result,(char (*) [6])"hello");
  Future<unsigned_long>::
  start<String_const&,String_const&,String_const&,String_const&,String_const&,String,String,String,String,String>
            ((Future<unsigned_long> *)local_c88,testFuture::FutureTest::staticTest5,&local_cb0,
             &local_cd8,&local_d00,&local_d28,(String *)&future_17.result);
  String::~String((String *)&future_17.result);
  String::~String(&local_d28);
  String::~String(&local_d00);
  String::~String(&local_cd8);
  String::~String(&local_cb0);
  Future<unsigned_long>::join((Future<unsigned_long> *)local_c88);
  puVar4 = Future::operator_cast_to_unsigned_long_((Future *)local_c88);
  if ((*puVar4 != 0x19) &&
     (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                            ,0x10e,"future == 25"), iVar3 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  Future<unsigned_long>::~Future((Future<unsigned_long> *)local_c88);
  Future<unsigned_long>::Future((Future<unsigned_long> *)&t_5);
  testFuture::FutureTest::FutureTest(&local_dd0);
  String::String<6ul>(&local_df8,(char (*) [6])"hello");
  Future<unsigned_long>::start<testFuture()::FutureTest,String_const&,String>
            ((Future<unsigned_long> *)&t_5,&local_dd0,0x104f90,(String *)0x0);
  String::~String(&local_df8);
  Future<unsigned_long>::join((Future<unsigned_long> *)&t_5);
  puVar4 = Future::operator_cast_to_unsigned_long_((Future *)&t_5);
  if ((*puVar4 != 0x2f) &&
     (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                            ,0x116,"future == 42 + 5"), iVar3 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  Future<unsigned_long>::~Future((Future<unsigned_long> *)&t_5);
  Future<unsigned_long>::Future((Future<unsigned_long> *)&t_6);
  testFuture::FutureTest::FutureTest(&local_e88);
  String::String<7ul>(&local_eb0,(char (*) [7])"hello1");
  String::String<7ul>(&local_ed8,(char (*) [7])"hello2");
  Future<unsigned_long>::start<testFuture()::FutureTest,String_const&,String_const&,String,String>
            ((Future<unsigned_long> *)&t_6,&local_e88,0x1050a0,(String *)0x0,&local_eb0);
  String::~String(&local_ed8);
  String::~String(&local_eb0);
  Future<unsigned_long>::join((Future<unsigned_long> *)&t_6);
  puVar4 = Future::operator_cast_to_unsigned_long_((Future *)&t_6);
  if ((*puVar4 != 0x36) &&
     (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                            ,0x11e,"future == 42 + 6 * 2"), iVar3 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  Future<unsigned_long>::~Future((Future<unsigned_long> *)&t_6);
  Future<unsigned_long>::Future((Future<unsigned_long> *)&t_7);
  testFuture::FutureTest::FutureTest(&local_f68);
  String::String<7ul>(&local_f90,(char (*) [7])"hello1");
  String::String<7ul>(&local_fb8,(char (*) [7])"hello2");
  String::String<7ul>(&local_fe0,(char (*) [7])"hello3");
  Future<unsigned_long>::
  start<testFuture()::FutureTest,String_const&,String_const&,String_const&,String,String,String>
            ((Future<unsigned_long> *)&t_7,&local_f68,0x1051c0,(String *)0x0,&local_f90,&local_fb8);
  String::~String(&local_fe0);
  String::~String(&local_fb8);
  String::~String(&local_f90);
  Future<unsigned_long>::join((Future<unsigned_long> *)&t_7);
  puVar4 = Future::operator_cast_to_unsigned_long_((Future *)&t_7);
  if ((*puVar4 != 0x3c) &&
     (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                            ,0x126,"future == 42 + 6 * 3"), iVar3 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  Future<unsigned_long>::~Future((Future<unsigned_long> *)&t_7);
  Future<unsigned_long>::Future((Future<unsigned_long> *)&t_8);
  testFuture::FutureTest::FutureTest(&local_1070);
  String::String<7ul>(&local_1098,(char (*) [7])"hello1");
  String::String<7ul>(&local_10c0,(char (*) [7])"hello2");
  String::String<7ul>(&local_10e8,(char (*) [7])"hello3");
  String::String<7ul>(&local_1110,(char (*) [7])"hello4");
  Future<unsigned_long>::
  start<testFuture()::FutureTest,String_const&,String_const&,String_const&,String_const&,String,String,String,String>
            ((Future<unsigned_long> *)&t_8,&local_1070,0x105310,(String *)0x0,&local_1098,
             &local_10c0,&local_10e8);
  String::~String(&local_1110);
  String::~String(&local_10e8);
  String::~String(&local_10c0);
  String::~String(&local_1098);
  Future<unsigned_long>::join((Future<unsigned_long> *)&t_8);
  puVar4 = Future::operator_cast_to_unsigned_long_((Future *)&t_8);
  if ((*puVar4 != 0x42) &&
     (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                            ,0x12e,"future == 42 + 6 * 4"), iVar3 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  Future<unsigned_long>::~Future((Future<unsigned_long> *)&t_8);
  return;
}

Assistant:

void testFuture()
{
  class FutureTest
  {
  public:
    bool called;

  public:
    FutureTest() : check(42) {}

    static void staticVoidTest0()
    {
    }

    static void staticVoidTest1(int check)
    {
      ASSERT(check == 32);
    }

    static void staticVoidTest2(int check, const String& str1)
    {
      ASSERT(check == 32);
      ASSERT(str1 == "hallo1");
    }

    static void staticVoidTest3(int check, const String& str1, const String& str2)
    {
      ASSERT(check == 32);
      ASSERT(str1 == "hallo1");
      ASSERT(str2 == "hallo2");
    }

    static void staticVoidTest4(int check, const String& str1, const String& str2, const String& str3)
    {
      ASSERT(check == 32);
      ASSERT(str1 == "hallo1");
      ASSERT(str2 == "hallo2");
      ASSERT(str3 == "hallo3");
    }

    static void staticVoidTest5(int check, const String& str1, const String& str2, const String& str3, const String& str4)
    {
      ASSERT(check == 32);
      ASSERT(str1 == "hallo1");
      ASSERT(str2 == "hallo2");
      ASSERT(str3 == "hallo3");
      ASSERT(str4 == "hallo4");
    }

    void memberVoidTest0()
    {
      called = true;
    }

    void memberVoidTest1(int check)
    {
      called = true;
      ASSERT(this->check + check == 42 + 32);
    }

    void memberVoidTest2(int check, const String& str1)
    {
      called = true;
      ASSERT(this->check + check == 42 + 32);
      ASSERT(str1 == "hallo1");
    }

    void memberVoidTest3(int check, const String& str1, const String& str2)
    {
      called = true;
      ASSERT(this->check + check == 42 + 32);
      ASSERT(str1 == "hallo1");
      ASSERT(str2 == "hallo2");
    }

    void memberVoidTest4(int check, const String& str1, const String& str2, const String& str3)
    {
      called = true;
      ASSERT(this->check + check == 42 + 32);
      ASSERT(str1 == "hallo1");
      ASSERT(str2 == "hallo2");
      ASSERT(str3 == "hallo3");
    }

    static usize staticTest0()
    {
      return 32;
    }

    static usize staticTest1(const String& str)
    {
      return str.length();
    }

    static usize staticTest2(const String& str1, const String& str2)
    {
      return str1.length() + str2.length();
    }

    static usize staticTest3(const String& str1, const String& str2, const String& str3)
    {
      return str1.length() + str2.length() + str3.length();
    }

    static usize staticTest4(const String& str1, const String& str2, const String& str3, const String& str4)
    {
      return str1.length() + str2.length() + str3.length() + str4.length();
    }

    static usize staticTest5(const String& str1, const String& str2, const String& str3, const String& str4, const String& str5)
    {
      return str1.length() + str2.length() + str3.length() + str4.length() + str5.length();
    }

    usize memberTest0()
    {
      return check;
    }

    usize memberTest1(const String& str)
    {
      return check + str.length();
    }

    usize memberTest2(const String& str1, const String& str2)
    {
      return check + str1.length() + str2.length();
    }

    usize memberTest3(const String& str1, const String& str2, const String& str3)
    {
      return check + str1.length() + str2.length() + str3.length();
    }

    usize memberTest4(const String& str1, const String& str2, const String& str3, const String& str4)
    {
      return check + str1.length() + str2.length() + str3.length() + str4.length();
    }

  private:
    int check;
  };

  {
    Future<void> future;
    ASSERT(!future.isAborting());
    ASSERT(!future.isFinished());
    ASSERT(!future.isAborted());
    future.start(&FutureTest::staticVoidTest0);
    future.join();
    ASSERT(!future.isAborting());
    ASSERT(future.isFinished());
    ASSERT(!future.isAborted());
  }

  {
    Future<void> future;
    future.start(&FutureTest::staticVoidTest1, 32);
    future.join();
  }

  {
    Future<void> future;
    future.start(&FutureTest::staticVoidTest2, 32, String("hallo1"));
    future.join();
  }

  {
    Future<void> future;
    future.start(&FutureTest::staticVoidTest3, 32, String("hallo1"), String("hallo2"));
    future.join();
  }

  {
    Future<void> future;
    future.start(&FutureTest::staticVoidTest4, 32, String("hallo1"), String("hallo2"), String("hallo3"));
    future.join();
  }

  {
    Future<void> future;
    future.start(&FutureTest::staticVoidTest5, 32, String("hallo1"), String("hallo2"), String("hallo3"), String("hallo4"));
    future.join();
  }

  {
    Future<void> future;
    FutureTest t;
    future.start(t, &FutureTest::memberVoidTest0);
    future.join();
    ASSERT(t.called);
  }

  {
    Future<void> future;
    FutureTest t;
    future.start(t, &FutureTest::memberVoidTest1, 32);
    future.join();
    ASSERT(t.called);
  }

  {
    Future<void> future;
    FutureTest t;
    future.start(t, &FutureTest::memberVoidTest2, 32, String("hallo1"));
    future.join();
    ASSERT(t.called);
  }

  {
    Future<void> future;
    FutureTest t;
    future.start(t, &FutureTest::memberVoidTest3, 32, String("hallo1"), String("hallo2"));
    future.join();
    ASSERT(t.called);
  }

  {
    Future<void> future;
    FutureTest t;
    future.start(t, &FutureTest::memberVoidTest4, 32, String("hallo1"), String("hallo2"), String("hallo3"));
    future.join();
    ASSERT(t.called);
  }

  {
    Future<usize> future;
    future.start(&FutureTest::staticTest0);
    future.join();
    ASSERT(future == 32);
  }

  {
    Future<usize> future;
    future.start(&FutureTest::staticTest1, String("hello"));
    future.join();
    ASSERT(future == 5);
  }

  {
    Future<usize> future;
    future.start(&FutureTest::staticTest2, String("hello"), String("hello"));
    future.join();
    ASSERT(future == 10);
  }

  {
    Future<usize> future;
    future.start(&FutureTest::staticTest3, String("hello"), String("hello"), String("hello"));
    future.join();
    ASSERT(future == 15);
  }

  {
    Future<usize> future;
    future.start(&FutureTest::staticTest4, String("hello"), String("hello"), String("hello"), String("hello"));
    future.join();
    ASSERT(future == 20);
  }

  {
    Future<usize> future;
    future.start(&FutureTest::staticTest5, String("hello"), String("hello"), String("hello"), String("hello"), String("hello"));
    future.join();
    ASSERT(future == 25);
  }

  {
    Future<usize> future;
    FutureTest t;
    future.start(t, &FutureTest::memberTest1, String("hello"));
    future.join();
    ASSERT(future == 42 + 5);
  }

  {
    Future<usize> future;
    FutureTest t;
    future.start(t, &FutureTest::memberTest2, String("hello1"), String("hello2"));
    future.join();
    ASSERT(future == 42 + 6 * 2);
  }

  {
    Future<usize> future;
    FutureTest t;
    future.start(t, &FutureTest::memberTest3, String("hello1"), String("hello2"), String("hello3"));
    future.join();
    ASSERT(future == 42 + 6 * 3);
  }

  {
    Future<usize> future;
    FutureTest t;
    future.start(t, &FutureTest::memberTest4, String("hello1"), String("hello2"), String("hello3"), String("hello4"));
    future.join();
    ASSERT(future == 42 + 6 * 4);
  }
}